

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

void __thiscall
S2Polyline::Init(S2Polyline *this,vector<S2LatLng,_std::allocator<S2LatLng>_> *vertices)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  Vector3<double> *__p;
  const_reference this_00;
  type pVVar6;
  ostream *poVar7;
  Vector3<double> *local_88;
  S2LogMessage local_58;
  S2LogMessageVoidify local_41;
  S2Point local_40;
  int local_28;
  int i;
  vector<S2LatLng,_std::allocator<S2LatLng>_> *local_18;
  vector<S2LatLng,_std::allocator<S2LatLng>_> *vertices_local;
  S2Polyline *this_local;
  
  local_18 = vertices;
  vertices_local = (vector<S2LatLng,_std::allocator<S2LatLng>_> *)this;
  sVar3 = std::vector<S2LatLng,_std::allocator<S2LatLng>_>::size(vertices);
  this->num_vertices_ = (int)sVar3;
  uVar4 = (ulong)this->num_vertices_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(0x18),0);
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __p = (Vector3<double> *)operator_new__(uVar5);
  if (uVar4 != 0) {
    local_88 = __p;
    do {
      Vector3<double>::Vector3(local_88);
      local_88 = local_88 + 1;
    } while (local_88 != __p + uVar4);
  }
  std::unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>>::
  reset<Vector3<double>*,void>
            ((unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>> *)
             &this->vertices_,__p);
  for (local_28 = 0; local_28 < this->num_vertices_; local_28 = local_28 + 1) {
    this_00 = std::vector<S2LatLng,_std::allocator<S2LatLng>_>::operator[](local_18,(long)local_28);
    S2LatLng::ToPoint(&local_40,this_00);
    pVVar6 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                       (&this->vertices_,(long)local_28);
    pVVar6->c_[0] = local_40.c_[0];
    pVVar6->c_[1] = local_40.c_[1];
    pVVar6->c_[2] = local_40.c_[2];
  }
  if ((((FLAGS_s2debug & 1U) != 0) && (this->s2debug_override_ == ALLOW)) &&
     (bVar2 = IsValid(this), ((bVar2 ^ 0xffU) & 1) != 0)) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0x71,kFatal,(ostream *)&std::cerr);
    poVar7 = S2LogMessage::stream(&local_58);
    poVar7 = std::operator<<(poVar7,"Check failed: IsValid() ");
    S2LogMessageVoidify::operator&(&local_41,poVar7);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  return;
}

Assistant:

void S2Polyline::Init(const vector<S2LatLng>& vertices) {
  num_vertices_ = vertices.size();
  vertices_.reset(new S2Point[num_vertices_]);
  for (int i = 0; i < num_vertices_; ++i) {
    vertices_[i] = vertices[i].ToPoint();
  }
  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    S2_CHECK(IsValid());
  }
}